

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O1

string * __thiscall
flatbuffers::java::GenMethod_abi_cxx11_(string *__return_storage_ptr__,java *this,FieldDef *field)

{
  uint uVar1;
  char *pcVar2;
  allocator local_39;
  string local_38;
  
  uVar1 = *(uint *)(this + 0x90);
  if (uVar1 - 1 < 0xc) {
    std::__cxx11::string::string
              ((string *)&local_38,
               *(char **)(GenTypeBasic[abi:cxx11](flatbuffers::Type_const&)::ctypename +
                         (ulong)uVar1 * 8),&local_39);
    MakeCamel(__return_storage_ptr__,&local_38,true);
  }
  else {
    if (uVar1 == 0xf) {
      pcVar2 = "Offset";
      if (*(char *)(*(long *)(this + 0x98) + 0xd8) != '\0') {
        pcVar2 = "Struct";
      }
    }
    else {
      pcVar2 = "Offset";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + 6);
  }
  if ((uVar1 - 1 < 0xc) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2)) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string GenMethod(const FieldDef &field) {
  return IsScalar(field.value.type.base_type)
    ? MakeCamel(GenTypeBasic(field.value.type))
    : (IsStruct(field.value.type) ? "Struct" : "Offset");
}